

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void ZopfliDeflatePart(ZopfliOptions *options,int btype,int final,uchar *in,size_t instart,
                      size_t inend,uchar *bp,uchar **out,size_t *outsize)

{
  bool bVar1;
  ZopfliOptions *pZVar2;
  uchar **ppuVar3;
  size_t sVar4;
  ZopfliLZ77Store *lz77_00;
  uchar **ppuVar5;
  uint symbol;
  unsigned_short *lstart;
  size_t sVar6;
  unsigned_short *lend;
  ulong uVar7;
  long lVar8;
  ZopfliOptions *pZVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  size_t *in_stack_fffffffffffffec0;
  size_t *psVar13;
  double local_130;
  uchar **local_118;
  size_t npoints;
  uint local_f4;
  size_t *splitpoints_uncompressed;
  double local_e8;
  ZopfliLZ77Store lz77;
  ZopfliLZ77Store store;
  ZopfliBlockState s_1;
  
  splitpoints_uncompressed = (size_t *)0x0;
  npoints = 0;
  if (btype == 1) {
    ZopfliInitLZ77Store(in,&store);
    ZopfliInitBlockState(options,instart,inend,1,(ZopfliBlockState *)&lz77);
    psVar13 = (size_t *)0x102ede;
    ZopfliLZ77OptimalFixed((ZopfliBlockState *)&lz77,in,instart,inend,&store);
    AddLZ77Block(options,1,final,&store,0,store.size,(size_t)bp,(uchar *)out,(uchar **)outsize,
                 psVar13);
    ZopfliCleanBlockState((ZopfliBlockState *)&lz77);
    ZopfliCleanLZ77Store(&store);
  }
  else if (btype == 0) {
    AddNonCompressedBlock
              ((ZopfliOptions *)(ulong)(uint)final,(int)in,(uchar *)instart,inend,(size_t)bp,
               (uchar *)out,(uchar **)outsize,in_stack_fffffffffffffec0);
  }
  else {
    if (options->blocksplitting == 0) {
      local_118 = (uchar **)0x0;
    }
    else {
      ZopfliBlockSplit(options,in,instart,inend,(long)options->blocksplittingmax,
                       &splitpoints_uncompressed,&npoints);
      local_118 = (uchar **)malloc(npoints << 3);
    }
    ZopfliInitLZ77Store(in,&lz77);
    local_130 = 0.0;
    for (uVar7 = 0; uVar7 <= npoints; uVar7 = uVar7 + 1) {
      sVar6 = instart;
      if (uVar7 != 0) {
        sVar6 = splitpoints_uncompressed[uVar7 - 1];
      }
      sVar4 = inend;
      if (uVar7 != npoints) {
        sVar4 = splitpoints_uncompressed[uVar7];
      }
      ZopfliInitLZ77Store(in,&store);
      ZopfliInitBlockState(options,sVar6,sVar4,1,&s_1);
      ZopfliLZ77Optimal(&s_1,in,sVar6,sVar4,options->numiterations,&store);
      dVar11 = ZopfliCalculateBlockSizeAutoType(&store,0,store.size);
      ZopfliAppendLZ77Store(&store,&lz77);
      if (uVar7 < npoints) {
        local_118[uVar7] = (uchar *)lz77.size;
      }
      local_130 = local_130 + dVar11;
      ZopfliCleanBlockState(&s_1);
      ZopfliCleanLZ77Store(&store);
    }
    if ((1 < npoints) && (options->blocksplitting != 0)) {
      store.litlens = (unsigned_short *)0x0;
      s_1.options = (ZopfliOptions *)0x0;
      ZopfliBlockSplitLZ77
                (options,&lz77,(long)options->blocksplittingmax,(size_t **)&store,(size_t *)&s_1);
      dVar11 = 0.0;
      lVar8 = 0;
      for (pZVar9 = (ZopfliOptions *)0x0; pZVar2 = s_1.options, pZVar9 <= s_1.options;
          pZVar9 = (ZopfliOptions *)((long)&pZVar9->verbose + 1)) {
        if (pZVar9 == (ZopfliOptions *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = *(size_t *)((long)store.litlens + lVar8 + -8);
        }
        psVar13 = (size_t *)((long)store.litlens + lVar8);
        if (pZVar9 == s_1.options) {
          psVar13 = &lz77.size;
        }
        dVar12 = ZopfliCalculateBlockSizeAutoType(&lz77,sVar6,*psVar13);
        dVar11 = dVar11 + dVar12;
        lVar8 = lVar8 + 8;
      }
      if (local_130 <= dVar11) {
        free(store.litlens);
      }
      else {
        free(local_118);
        local_118 = (uchar **)store.litlens;
        npoints = (size_t)pZVar2;
      }
    }
    ppuVar5 = local_118;
    for (uVar7 = 0; uVar7 <= npoints; uVar7 = uVar7 + 1) {
      if (uVar7 == 0) {
        lstart = (unsigned_short *)0x0;
      }
      else {
        lstart = (unsigned_short *)ppuVar5[-1];
      }
      ppuVar3 = ppuVar5;
      if (uVar7 == npoints) {
        ppuVar3 = (uchar **)&lz77.size;
      }
      lend = (unsigned_short *)*ppuVar3;
      symbol = (uint)(uVar7 == npoints && final != 0);
      dVar11 = ZopfliCalculateBlockSize(&lz77,(size_t)lstart,(size_t)lend,0);
      local_130 = ZopfliCalculateBlockSize(&lz77,(size_t)lstart,(size_t)lend,1);
      dVar12 = ZopfliCalculateBlockSize(&lz77,(size_t)lstart,(size_t)lend,2);
      bVar10 = 999 < lz77.size;
      bVar1 = dVar12 * 1.1 < local_130;
      if (lstart == lend) {
        AddBits(symbol,1,bp,out,outsize);
        AddBits(1,2,bp,out,outsize);
        AddBits(0,7,bp,out,outsize);
      }
      else {
        psVar13 = (size_t *)0x1032a9;
        local_f4 = symbol;
        local_e8 = dVar12;
        ZopfliInitLZ77Store(lz77.data,&store);
        if (!bVar10 || !bVar1) {
          sVar6 = lz77.pos[(long)lstart];
          sVar4 = ZopfliLZ77GetByteRange(&lz77,(size_t)lstart,(size_t)lend);
          ZopfliInitBlockState(options,sVar6,sVar4 + sVar6,1,&s_1);
          ZopfliLZ77OptimalFixed(&s_1,lz77.data,sVar6,sVar4 + sVar6,&store);
          local_130 = ZopfliCalculateBlockSize(&store,0,store.size,1);
          psVar13 = (size_t *)0x10332a;
          ZopfliCleanBlockState(&s_1);
        }
        if ((local_130 <= dVar11) || (local_e8 <= dVar11)) {
          if (local_e8 <= local_130) {
            AddLZ77Block(options,2,local_f4,&lz77,(size_t)lstart,(size_t)lend,(size_t)bp,
                         (uchar *)out,(uchar **)outsize,(size_t *)0x2);
          }
          else {
            if (bVar10 && bVar1) {
              lz77_00 = &lz77;
            }
            else {
              lz77_00 = &store;
              lstart = (unsigned_short *)0x0;
              lend = (unsigned_short *)store.size;
            }
            AddLZ77Block(options,1,local_f4,lz77_00,(size_t)lstart,(size_t)lend,(size_t)bp,
                         (uchar *)out,(uchar **)outsize,(size_t *)0x2);
          }
        }
        else {
          AddLZ77Block(options,0,local_f4,&lz77,(size_t)lstart,(size_t)lend,(size_t)bp,(uchar *)out,
                       (uchar **)outsize,psVar13);
        }
        ZopfliCleanLZ77Store(&store);
      }
      ppuVar5 = ppuVar5 + 1;
    }
    ZopfliCleanLZ77Store(&lz77);
    free(local_118);
    free(splitpoints_uncompressed);
  }
  return;
}

Assistant:

void ZopfliDeflatePart(const ZopfliOptions* options, int btype, int final,
                       const unsigned char* in, size_t instart, size_t inend,
                       unsigned char* bp, unsigned char** out,
                       size_t* outsize) {
  size_t i;
  /* byte coordinates rather than lz77 index */
  size_t* splitpoints_uncompressed = 0;
  size_t npoints = 0;
  size_t* splitpoints = 0;
  double totalcost = 0;
  ZopfliLZ77Store lz77;

  /* If btype=2 is specified, it tries all block types. If a lesser btype is
  given, then however it forces that one. Neither of the lesser types needs
  block splitting as they have no dynamic huffman trees. */
  if (btype == 0) {
    AddNonCompressedBlock(options, final, in, instart, inend, bp, out, outsize);
    return;
  } else if (btype == 1) {
    ZopfliLZ77Store store;
    ZopfliBlockState s;
    ZopfliInitLZ77Store(in, &store);
    ZopfliInitBlockState(options, instart, inend, 1, &s);

    ZopfliLZ77OptimalFixed(&s, in, instart, inend, &store);
    AddLZ77Block(options, btype, final, &store, 0, store.size, 0,
                 bp, out, outsize);

    ZopfliCleanBlockState(&s);
    ZopfliCleanLZ77Store(&store);
    return;
  }


  if (options->blocksplitting) {
    ZopfliBlockSplit(options, in, instart, inend,
                     options->blocksplittingmax,
                     &splitpoints_uncompressed, &npoints);
    splitpoints = (size_t*)malloc(sizeof(*splitpoints) * npoints);
  }

  ZopfliInitLZ77Store(in, &lz77);

  for (i = 0; i <= npoints; i++) {
    size_t start = i == 0 ? instart : splitpoints_uncompressed[i - 1];
    size_t end = i == npoints ? inend : splitpoints_uncompressed[i];
    ZopfliBlockState s;
    ZopfliLZ77Store store;
    ZopfliInitLZ77Store(in, &store);
    ZopfliInitBlockState(options, start, end, 1, &s);
    ZopfliLZ77Optimal(&s, in, start, end, options->numiterations, &store);
    totalcost += ZopfliCalculateBlockSizeAutoType(&store, 0, store.size);

    ZopfliAppendLZ77Store(&store, &lz77);
    if (i < npoints) splitpoints[i] = lz77.size;

    ZopfliCleanBlockState(&s);
    ZopfliCleanLZ77Store(&store);
  }

  /* Second block splitting attempt */
  if (options->blocksplitting && npoints > 1) {
    size_t* splitpoints2 = 0;
    size_t npoints2 = 0;
    double totalcost2 = 0;

    ZopfliBlockSplitLZ77(options, &lz77,
                         options->blocksplittingmax, &splitpoints2, &npoints2);

    for (i = 0; i <= npoints2; i++) {
      size_t start = i == 0 ? 0 : splitpoints2[i - 1];
      size_t end = i == npoints2 ? lz77.size : splitpoints2[i];
      totalcost2 += ZopfliCalculateBlockSizeAutoType(&lz77, start, end);
    }

    if (totalcost2 < totalcost) {
      free(splitpoints);
      splitpoints = splitpoints2;
      npoints = npoints2;
    } else {
      free(splitpoints2);
    }
  }

  for (i = 0; i <= npoints; i++) {
    size_t start = i == 0 ? 0 : splitpoints[i - 1];
    size_t end = i == npoints ? lz77.size : splitpoints[i];
    AddLZ77BlockAutoType(options, i == npoints && final,
                         &lz77, start, end, 0,
                         bp, out, outsize);
  }

  ZopfliCleanLZ77Store(&lz77);
  free(splitpoints);
  free(splitpoints_uncompressed);
}